

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

void vrna_md_defaults_reset(vrna_md_t *md_p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar3;
  double dVar6;
  byte bVar7;
  uint extraout_EAX;
  uint uVar8;
  undefined4 extraout_EAX_00;
  size_t __n;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar15;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  
  defaults.special_hp = 1;
  defaults.noLP = 0;
  defaults.noGU = 0;
  defaults.noGUclosure = 0;
  defaults.logML = 0;
  defaults.circ = 0;
  defaults.gquad = 0;
  defaults.uniq_ML = 0;
  defaults.compute_bpp = 1;
  defaults.backtrack_type = 'F';
  defaults.energy_set = 0;
  defaults.backtrack = 1;
  defaults.max_bp_span = -1;
  defaults.min_loop_size = 3;
  defaults.window_size = -1;
  defaults.oldAliEn = 0;
  defaults.ribo = 0;
  defaults.cv_fact = 1.0;
  defaults.nc_fact = 1.0;
  defaults.temperature = 37.0;
  defaults.betaScale = 1.0;
  defaults.pf_smooth = 1;
  defaults.dangles = 2;
  defaults.sfact = 1.07;
  defaults.nonstandards[0] = '\0';
  if (md_p != (vrna_md_t *)0x0) {
    uVar8 = md_p->dangles;
    if (uVar8 < 4) {
      defaults.dangles = uVar8;
      defaults.pf_smooth = 1;
      dangles = uVar8;
    }
    else {
      vrna_message_warning
                (
                "vrna_md_defaults_dangles@model.c: Dangles out of range, must be (0 <= d <= 3). Not changing anything!"
                );
      uVar8 = extraout_EAX;
    }
    uVar1 = md_p->special_hp;
    uVar4 = md_p->noLP;
    iVar11 = -(uint)(uVar1 == 0);
    iVar15 = -(uint)(uVar4 == 0);
    auVar16._4_4_ = iVar11;
    auVar16._0_4_ = iVar11;
    auVar16._8_4_ = iVar15;
    auVar16._12_4_ = iVar15;
    uVar8 = movmskpd(uVar8,auVar16);
    tetra_loop = (uVar8 ^ 3) & 1;
    uVar12 = ~CONCAT44(iVar15,iVar11) & (ulong)DAT_002df7d0;
    defaults.special_hp = (int)uVar12;
    defaults.noLP = (int)(uVar12 >> 0x20);
    noLonelyPairs = (uVar8 ^ 3) >> 1 & 0x7f;
    defaults.noGU = (int)(md_p->noGU != 0);
    noGU = defaults.noGU;
    vrna_md_update(&defaults);
    auVar13._0_4_ = -(uint)(md_p->noGUclosure == 0);
    auVar13._4_4_ = -(uint)(md_p->logML == 0);
    auVar13._8_4_ = -(uint)(md_p->circ == 0);
    auVar13._12_4_ = -(uint)(md_p->gquad == 0);
    uVar8 = movmskps(extraout_EAX_00,auVar13);
    bVar9 = (byte)(uVar8 ^ 0xf);
    no_closingGU = (uVar8 ^ 0xf) & 1;
    logML = (int)((bVar9 & 2) >> 1);
    gquad = (int)(bVar9 >> 3);
    defaults.noGUclosure = ~auVar13._0_4_ & 1;
    defaults.logML = ~auVar13._4_4_ & 1;
    defaults.circ = ~auVar13._8_4_ & 1;
    circ = (int)((bVar9 & 4) >> 2);
    bVar10 = md_p->uniq_ML != 0;
    uniq_ML = (int)bVar10;
    defaults.uniq_ML._1_3_ = 0;
    defaults._48_5_ = CONCAT14(bVar10,~auVar13._12_4_) & 0xff00000001;
    uVar8 = md_p->compute_bpp;
    defaults.compute_bpp = 1;
    if (uVar8 < 3) {
      defaults.compute_bpp = uVar8;
      do_backtrack = uVar8;
    }
    defaults.backtrack._0_1_ = md_p->backtrack != 0;
    defaults.backtrack._1_3_ = 0;
    bVar9 = md_p->backtrack_type;
    if ((10 < bVar9 - 0x43) || (bVar7 = bVar9, (0x409U >> (bVar9 - 0x43 & 0x1f) & 1) == 0)) {
      vrna_message_warning
                (
                "vrna_md_defaults_backtrack_type@model.c: Backtrack type must be any of \'F\', \'C\', or \'M\'. Not changing anything!"
                );
      bVar9 = backtrack_type;
      bVar7 = defaults.backtrack_type;
    }
    defaults.backtrack_type = bVar7;
    backtrack_type = bVar9;
    vrna_md_defaults_energy_set(md_p->energy_set);
    max_bp_span = md_p->max_bp_span;
    if (max_bp_span < 1) {
      max_bp_span = -1;
    }
    defaults.min_loop_size = 0;
    if (0 < md_p->min_loop_size) {
      defaults.min_loop_size = md_p->min_loop_size;
    }
    defaults.max_bp_span = max_bp_span;
    defaults.window_size = md_p->window_size;
    if (defaults.window_size < 1) {
      defaults.window_size = -1;
    }
    uVar2 = md_p->oldAliEn;
    uVar5 = md_p->ribo;
    iVar11 = -(uint)(uVar2 == 0);
    iVar15 = -(uint)(uVar5 == 0);
    auVar14._4_4_ = iVar11;
    auVar14._0_4_ = iVar11;
    auVar14._8_4_ = iVar15;
    auVar14._12_4_ = iVar15;
    uVar8 = movmskpd(defaults.window_size,auVar14);
    oldAliEn = (uVar8 ^ 3) & 1;
    uVar12 = ~CONCAT44(iVar15,iVar11) & (ulong)DAT_002df7d0;
    defaults.oldAliEn = (int)uVar12;
    defaults.ribo = (int)(uVar12 >> 0x20);
    ribo = (uVar8 ^ 3) >> 1 & 0x7f;
    cv_fact = md_p->cv_fact;
    nc_fact = md_p->nc_fact;
    dVar3 = md_p->temperature;
    dVar6 = dVar3;
    defaults.cv_fact = cv_fact;
    defaults.nc_fact = nc_fact;
    if (dVar3 < -273.15) {
      vrna_message_warning
                (
                "vrna_md_defaults_temperature@model.c: Temperature out of range, T must be above absolute zero. Not changing anything!"
                );
      dVar3 = temperature;
      dVar6 = defaults.temperature;
    }
    defaults.temperature = dVar6;
    temperature = dVar3;
    defaults.betaScale = md_p->betaScale;
    defaults.pf_smooth = md_p->pf_smooth;
    defaults.sfact = md_p->sfact;
    __n = strlen(md_p->nonstandards);
    if ((__n & 0xffffffc0) == 0) {
      memcpy(defaults.nonstandards,md_p->nonstandards,__n);
      defaults.nonstandards[(uint)__n & 0x3f] = '\0';
    }
  }
  vrna_md_update(&defaults);
  temperature = defaults.temperature;
  pf_scale = -1.0;
  dangles = defaults.dangles;
  tetra_loop = defaults.special_hp;
  noLonelyPairs = defaults.noLP;
  noGU = defaults.noGU;
  no_closingGU = defaults.noGUclosure;
  circ = defaults.circ;
  gquad = defaults.gquad;
  uniq_ML = defaults.uniq_ML;
  energy_set = defaults.energy_set;
  do_backtrack = defaults.compute_bpp;
  backtrack_type = defaults.backtrack_type;
  nonstandards = defaults.nonstandards;
  max_bp_span = defaults.max_bp_span;
  oldAliEn = defaults.oldAliEn;
  ribo = defaults.ribo;
  cv_fact = defaults.cv_fact;
  nc_fact = defaults.nc_fact;
  logML = defaults.logML;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_reset(vrna_md_t *md_p)
{
  /* first, reset to factory defaults */
  defaults.dangles          = VRNA_MODEL_DEFAULT_DANGLES;
  defaults.special_hp       = VRNA_MODEL_DEFAULT_SPECIAL_HP;
  defaults.noLP             = VRNA_MODEL_DEFAULT_NO_LP;
  defaults.noGU             = VRNA_MODEL_DEFAULT_NO_GU;
  defaults.noGUclosure      = VRNA_MODEL_DEFAULT_NO_GU_CLOSURE;
  defaults.logML            = VRNA_MODEL_DEFAULT_LOG_ML;
  defaults.gquad            = VRNA_MODEL_DEFAULT_GQUAD;
  defaults.circ             = VRNA_MODEL_DEFAULT_CIRC;
  defaults.uniq_ML          = VRNA_MODEL_DEFAULT_UNIQ_ML;
  defaults.compute_bpp      = VRNA_MODEL_DEFAULT_COMPUTE_BPP;
  defaults.backtrack        = VRNA_MODEL_DEFAULT_BACKTRACK;
  defaults.backtrack_type   = VRNA_MODEL_DEFAULT_BACKTRACK_TYPE;
  defaults.energy_set       = VRNA_MODEL_DEFAULT_ENERGY_SET;
  defaults.max_bp_span      = VRNA_MODEL_DEFAULT_MAX_BP_SPAN;
  defaults.min_loop_size    = TURN;
  defaults.window_size      = VRNA_MODEL_DEFAULT_WINDOW_SIZE;
  defaults.oldAliEn         = VRNA_MODEL_DEFAULT_ALI_OLD_EN;
  defaults.ribo             = VRNA_MODEL_DEFAULT_ALI_RIBO;
  defaults.cv_fact          = VRNA_MODEL_DEFAULT_ALI_CV_FACT;
  defaults.nc_fact          = VRNA_MODEL_DEFAULT_ALI_NC_FACT;
  defaults.temperature      = VRNA_MODEL_DEFAULT_TEMPERATURE;
  defaults.betaScale        = VRNA_MODEL_DEFAULT_BETA_SCALE;
  defaults.pf_smooth        = VRNA_MODEL_DEFAULT_PF_SMOOTH;
  defaults.sfact            = 1.07;
  defaults.nonstandards[0]  = '\0';

  if (md_p) {
    /* now try to apply user settings */
    /*
     *  Note that we use wrapper functions here instead of
     *  faster direct memory copy because we want to ensure
     *  that model settings always comply to the constraints
     *  we set in the wrappers
     */
    vrna_md_defaults_dangles(md_p->dangles);
    vrna_md_defaults_special_hp(md_p->special_hp);
    vrna_md_defaults_noLP(md_p->noLP);
    vrna_md_defaults_noGU(md_p->noGU);
    vrna_md_defaults_noGUclosure(md_p->noGUclosure);
    vrna_md_defaults_logML(md_p->logML);
    vrna_md_defaults_gquad(md_p->gquad);
    vrna_md_defaults_circ(md_p->circ);
    vrna_md_defaults_uniq_ML(md_p->uniq_ML);
    vrna_md_defaults_compute_bpp(md_p->compute_bpp);
    vrna_md_defaults_backtrack(md_p->backtrack);
    vrna_md_defaults_backtrack_type(md_p->backtrack_type);
    vrna_md_defaults_energy_set(md_p->energy_set);
    vrna_md_defaults_max_bp_span(md_p->max_bp_span);
    vrna_md_defaults_min_loop_size(md_p->min_loop_size);
    vrna_md_defaults_window_size(md_p->window_size);
    vrna_md_defaults_oldAliEn(md_p->oldAliEn);
    vrna_md_defaults_ribo(md_p->ribo);
    vrna_md_defaults_cv_fact(md_p->cv_fact);
    vrna_md_defaults_nc_fact(md_p->nc_fact);
    vrna_md_defaults_temperature(md_p->temperature);
    vrna_md_defaults_betaScale(md_p->betaScale);
    vrna_md_defaults_pf_smooth(md_p->pf_smooth);
    vrna_md_defaults_sfact(md_p->sfact);
    copy_nonstandards(&defaults, &(md_p->nonstandards[0]));
  }

  /* update pair/rtype/alias arrays accordingly */
  vrna_md_update(&defaults);

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
  temperature     = defaults.temperature;
  pf_scale        = VRNA_MODEL_DEFAULT_PF_SCALE;
  dangles         = defaults.dangles;
  tetra_loop      = defaults.special_hp;
  noLonelyPairs   = defaults.noLP;
  noGU            = defaults.noGU;
  no_closingGU    = defaults.noGUclosure;
  circ            = defaults.circ;
  gquad           = defaults.gquad;
  uniq_ML         = defaults.uniq_ML;
  energy_set      = defaults.energy_set;
  do_backtrack    = defaults.compute_bpp;
  backtrack_type  = defaults.backtrack_type;
  nonstandards    = defaults.nonstandards;
  max_bp_span     = defaults.max_bp_span;
  oldAliEn        = defaults.oldAliEn;
  ribo            = defaults.ribo;
  cv_fact         = defaults.cv_fact;
  nc_fact         = defaults.nc_fact;
  logML           = defaults.logML;
#endif
}